

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::DoTrackMergedValueForKills
          (GlobOpt *this,Value *value,GlobOptBlockData *blockData,
          BVSparse<Memory::JitArenaAllocator> *mergedValueTypesTrackedForKills)

{
  ValueType *this_00;
  ValueInfo *valueInfo;
  code *pcVar1;
  BVSparse<Memory::JitArenaAllocator> *this_01;
  bool bVar2;
  bool bVar3;
  BOOLEAN BVar4;
  undefined4 *puVar5;
  ArrayValueInfo *pAVar6;
  Value *local_50;
  BVSparse<Memory::JitArenaAllocator> *local_48;
  GlobOptBlockData *local_40;
  Value *local_38;
  Value *value_local;
  
  local_38 = value;
  if (value == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d3,"(value)","value");
    if (!bVar2) goto LAB_0046d3ab;
    *puVar5 = 0;
  }
  if (blockData == (GlobOptBlockData *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d4,"(blockData)","blockData");
    if (!bVar2) goto LAB_0046d3ab;
    *puVar5 = 0;
  }
  valueInfo = local_38->valueInfo;
  this_00 = &valueInfo->super_ValueType;
  local_48 = mergedValueTypesTrackedForKills;
  bVar2 = ValueType::IsAnyOptimizedArray(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32d7,"(valueInfo->IsAnyOptimizedArray())",
                       "valueInfo->IsAnyOptimizedArray()");
    if (!bVar2) goto LAB_0046d3ab;
    *puVar5 = 0;
  }
  local_40 = blockData;
  bVar2 = ValueType::IsArrayOrObjectWithArray(this_00);
  bVar3 = ValueType::IsOptimizedTypedArray(this_00);
  if (bVar2 == bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x32da,"(!isJsArray == valueInfo->IsOptimizedTypedArray())",
                       "!isJsArray == valueInfo->IsOptimizedTypedArray()");
    if (!bVar3) {
LAB_0046d3ab:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar3 = ValueType::IsOptimizedVirtualTypedArray(this_00);
  VerifyArrayValueInfoForTracking(this,valueInfo,bVar2,this->currentBlock,true);
  this_01 = local_48;
  if (!bVar3 && !bVar2) {
    bVar2 = ValueInfo::IsArrayValueInfo(valueInfo);
    if (!bVar2) {
      return;
    }
    pAVar6 = ValueInfo::AsArrayValueInfo(valueInfo);
    if (pAVar6->headSegmentLengthSym == (StackSym *)0x0) {
      return;
    }
  }
  if ((this_01 != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     (BVar4 = BVSparse<Memory::JitArenaAllocator>::TestAndSet(this_01,local_38->valueNumber),
     BVar4 != '\0')) {
    return;
  }
  local_50 = local_38;
  JsUtil::
  BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<Value*,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              *)local_40->valuesToKillOnCalls,&local_50,&local_38);
  return;
}

Assistant:

void
GlobOpt::DoTrackMergedValueForKills(
    Value *const value,
    GlobOptBlockData *const blockData,
    BVSparse<JitArenaAllocator> *const mergedValueTypesTrackedForKills) const
{
    Assert(value);
    Assert(blockData);

    ValueInfo *valueInfo = value->GetValueInfo();
    Assert(valueInfo->IsAnyOptimizedArray());

    const bool isJsArray = valueInfo->IsArrayOrObjectWithArray();
    Assert(!isJsArray == valueInfo->IsOptimizedTypedArray());

    const bool isVirtualTypedArray = valueInfo->IsOptimizedVirtualTypedArray();

#if DBG
    VerifyArrayValueInfoForTracking(valueInfo, isJsArray, currentBlock, true);
#endif

    if(!isJsArray && !isVirtualTypedArray && !(valueInfo->IsArrayValueInfo() && valueInfo->AsArrayValueInfo()->HeadSegmentLengthSym()))
    {
        return;
    }

    // Can't assume going forward that it will definitely be an array without disabling implicit calls, because the
    // array may be transformed into an ES5 array. Since array opts are enabled, implicit calls can be disabled, and we can
    // treat it as a definite value type going forward, but the value needs to be tracked so that something like a call can
    // revert the value type to a likely version.
    if(!mergedValueTypesTrackedForKills || !mergedValueTypesTrackedForKills->TestAndSet(value->GetValueNumber()))
    {
        blockData->valuesToKillOnCalls->Add(value);
    }
}